

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall BaseSocketImpl::StartClosingCB(BaseSocketImpl *this)

{
  bool bVar1;
  undefined1 local_60 [8];
  function<void_(BaseSocket_*)> tmpfun_1;
  undefined1 local_30 [8];
  function<void_(BaseSocket_*,_void_*)> tmpfun;
  BaseSocketImpl *this_local;
  
  tmpfun._M_invoker = (_Invoker_type)this;
  std::mutex::lock(&this->m_mxFnClosing);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fClosingParam);
  if (bVar1) {
    std::function<void_(BaseSocket_*,_void_*)>::function
              ((function<void_(BaseSocket_*,_void_*)> *)local_30);
    std::function<void_(BaseSocket_*,_void_*)>::swap
              (&this->m_fClosingParam,(function<void_(BaseSocket_*,_void_*)> *)local_30);
    std::mutex::unlock(&this->m_mxFnClosing);
    std::function<void_(BaseSocket_*,_void_*)>::operator()
              ((function<void_(BaseSocket_*,_void_*)> *)local_30,this->m_pBkRef,this->m_pvUserData);
    std::function<void_(BaseSocket_*,_void_*)>::~function
              ((function<void_(BaseSocket_*,_void_*)> *)local_30);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->m_fClosing);
    if (bVar1) {
      std::function<void_(BaseSocket_*)>::function((function<void_(BaseSocket_*)> *)local_60);
      std::function<void_(BaseSocket_*)>::swap
                (&this->m_fClosing,(function<void_(BaseSocket_*)> *)local_60);
      std::mutex::unlock(&this->m_mxFnClosing);
      std::function<void_(BaseSocket_*)>::operator()
                ((function<void_(BaseSocket_*)> *)local_60,this->m_pBkRef);
      std::function<void_(BaseSocket_*)>::~function((function<void_(BaseSocket_*)> *)local_60);
    }
    else {
      std::mutex::unlock(&this->m_mxFnClosing);
    }
  }
  return;
}

Assistant:

void BaseSocketImpl::StartClosingCB()
{
    m_mxFnClosing.lock();
    if (m_fClosingParam)
    {
        function<void(BaseSocket*, void*)> tmpfun;
        m_fClosingParam.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef, m_pvUserData);
    }
    else if (m_fClosing)
    {
        function<void(BaseSocket*)> tmpfun;
        m_fClosing.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef);
    }
    else
        m_mxFnClosing.unlock();
}